

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

void __thiscall Texture::loadTexture(Texture *this,string *imagePath)

{
  pointer pcVar1;
  string *psVar2;
  GLuint GVar3;
  ResourceManager *pRVar4;
  uchar *img_data;
  ostream *poVar5;
  long *plVar6;
  string local_90;
  string local_70;
  int local_50;
  int local_4c;
  int width;
  int height;
  string *local_40;
  GLuint local_38;
  bool local_31;
  GLuint texture_id;
  bool succes;
  
  local_31 = false;
  pRVar4 = ResourceManager::getInstance();
  pcVar1 = (imagePath->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_40 = imagePath;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + imagePath->_M_string_length);
  GVar3 = ResourceManager::getTexture(pRVar4,&local_90,&local_31);
  this->textureBuffer = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  psVar2 = local_40;
  if (local_31 == false) {
    _width = this;
    glEnable(0xde1);
    glGenTextures(1,&local_38);
    glBindTexture(0xde1,local_38);
    img_data = SOIL_load_image((psVar2->_M_dataplus)._M_p,&local_50,&local_4c,(int *)0x0,4);
    glTexImage2D(0xde1,0,0x1908,local_50,local_4c,0,0x1908,0x1401,img_data);
    glTexParameteri(0xde1,0x2802,0x2901);
    glTexParameteri(0xde1,0x2803,0x2901);
    glTexParameteri(0xde1,0x2800,0x2601);
    glTexParameteri(0xde1,0x2801,0x2703);
    (*__glewGenerateMipmap)(0xde1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Width: ",7);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", Height: ",10);
    psVar2 = local_40;
    plVar6 = (long *)std::ostream::operator<<(poVar5,local_4c);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image ID: ",10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    SOIL_free_image_data(img_data);
    if (local_38 == 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed loading: ",0x10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    _width->textureBuffer = local_38;
    pRVar4 = ResourceManager::getInstance();
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + psVar2->_M_string_length);
    ResourceManager::addTexture(pRVar4,local_38,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Texture::loadTexture(std::string imagePath)
{
	bool succes = false;
	this->textureBuffer = ResourceManager::getInstance()->getTexture(imagePath, succes);
	if (succes)
	{
		return;
	}
	glEnable(GL_TEXTURE_2D);

	GLuint texture_id;
	glGenTextures(1, &texture_id);
	glBindTexture(GL_TEXTURE_2D, texture_id);
	int width;
	int height;
	unsigned char* image = SOIL_load_image(imagePath.c_str(), &width, &height, 0, SOIL_LOAD_RGBA);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, image);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
	glGenerateMipmap(GL_TEXTURE_2D);


	std::cout << "Width: " << width << ", Height: " << height << std::endl;
	std::cout << "Image ID: " << texture_id << std::endl;

	SOIL_free_image_data(image);

	if (texture_id == -1)
	{
		std::cout << "Failed loading: " << imagePath << std::endl;
	}
	
	textureBuffer = texture_id;
	ResourceManager::getInstance()->addTexture(texture_id, imagePath);
}